

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_utils.cpp
# Opt level: O1

RuleBuilder * __thiscall Potassco::RuleBuilder::startMinimize(RuleBuilder *this,Weight_t prio)

{
  Weight_t *pWVar1;
  uint32_t t;
  uint uVar2;
  ulong n;
  uint *puVar3;
  
  puVar3 = (uint *)(this->mem_).beg_;
  if ((int)*puVar3 < 0) {
    puVar3[1] = 0;
    puVar3[2] = 0;
    puVar3[3] = 0;
    puVar3[4] = 0;
    *puVar3 = 0x14;
  }
  if (((puVar3[1] & 0x3fffffff) == 0) && ((puVar3[3] & 0x3fffffff) == 0)) {
    uVar2 = *puVar3 & 0x7fffffff;
    puVar3[2] = uVar2;
    puVar3[1] = *puVar3 & 0x3fffffff | 0x80000000;
    n = (ulong)uVar2 + 4;
    if ((ulong)((long)(this->mem_).end_ - (long)(this->mem_).beg_) < n) {
      MemoryRegion::grow(&this->mem_,n);
      puVar3 = (uint *)(this->mem_).beg_;
    }
    pWVar1 = (Weight_t *)MemoryRegion::operator[](&this->mem_,(ulong)uVar2);
    *pWVar1 = prio;
    uVar2 = (uint)n & 0x7fffffff;
    *puVar3 = *puVar3 & 0x80000000 | uVar2;
    puVar3[4] = uVar2;
    puVar3[3] = (uint)n & 0x3fffffff | 0x40000000;
    return this;
  }
  fail(-1,"RuleBuilder &Potassco::RuleBuilder::startMinimize(Weight_t)",0x98,
       "!r->head.mbeg && !r->body.mbeg","Invalid call to startMinimize()",0);
}

Assistant:

RuleBuilder& RuleBuilder::startMinimize(Weight_t prio) {
	Rule* r = unfreeze(true);
	POTASSCO_ASSERT(!r->head.mbeg && !r->body.mbeg, "Invalid call to startMinimize()");
	r->head.init(r->top, Directive_t::Minimize);
	r = push(mem_, r, prio);
	r->body.init(r->top, Body_t::Sum);
	return *this;
}